

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::Checkpoint
          (RowGroupCollection *this,TableDataWriter *writer,TableStatistics *global_stats)

{
  bool bVar1;
  DatabaseInstance *db;
  size_type sVar2;
  __int_type _Var3;
  string *msg;
  SegmentLock *in_RSI;
  RowGroupPointer pointer;
  type row_group_writer;
  RowGroup *row_group;
  value_type *entry_1;
  idx_t segment_idx_1;
  idx_t new_total_rows;
  ErrorData error;
  exception *e;
  unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
  checkpoint_task;
  bool vacuum_tasks;
  value_type *entry;
  idx_t segment_idx;
  DBConfig *config;
  idx_t total_vacuum_tasks;
  VacuumState vacuum_state;
  CollectionCheckpointState checkpoint_state;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  SegmentLock l;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_fffffffffffffbf8;
  CollectionCheckpointState *in_stack_fffffffffffffc00;
  RowGroupCollection *in_stack_fffffffffffffc08;
  SegmentLock *in_stack_fffffffffffffc10;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_fffffffffffffc18;
  TableDataWriter **ppTVar4;
  TableStatistics *in_stack_fffffffffffffc30;
  RowGroupCollection *in_stack_fffffffffffffc38;
  RowGroup *in_stack_fffffffffffffc40;
  allocator *this_00;
  RowGroupCollection *in_stack_fffffffffffffc48;
  CollectionCheckpointState *in_stack_fffffffffffffc50;
  CollectionCheckpointState *in_stack_fffffffffffffc58;
  RowGroupCollection *in_stack_fffffffffffffc60;
  ulong uVar5;
  pointer in_stack_fffffffffffffc88;
  undefined1 *in_stack_fffffffffffffc90;
  pointer in_stack_fffffffffffffc98;
  pointer in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  CollectionCheckpointState local_310;
  undefined1 local_28a;
  allocator local_289;
  string local_288 [40];
  type local_260;
  reference local_258;
  ulong local_250;
  long local_248;
  undefined1 local_138 [23];
  undefined1 local_121;
  reference local_120;
  ulong local_118;
  DBConfig *local_110;
  long local_108;
  long local_f8;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  local_40 [2];
  SegmentLock *local_10;
  
  local_10 = in_RSI;
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
            ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_fffffffffffffc00);
  SegmentTree<duckdb::RowGroup,_true>::Lock(in_stack_fffffffffffffbf8);
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
            ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_fffffffffffffc00);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  CollectionCheckpointState::CollectionCheckpointState
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             (TableDataWriter *)in_stack_fffffffffffffc40,
             (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)in_stack_fffffffffffffc38,
             in_stack_fffffffffffffc30);
  VacuumState::VacuumState((VacuumState *)0xbb286a);
  InitializeVacuumState
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
             (VacuumState *)in_stack_fffffffffffffc50,
             (vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)in_stack_fffffffffffffc48);
  local_108 = 0;
  db = TableDataWriter::GetDatabase((TableDataWriter *)0xbb28aa);
  local_110 = DBConfig::GetConfig(db);
  for (local_118 = 0; uVar5 = local_118,
      sVar2 = ::std::
              vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
              ::size(local_40), uVar5 < sVar2; local_118 = local_118 + 1) {
    local_120 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                          ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)
                           in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
    in_stack_fffffffffffffcaf =
         ScheduleVacuumTasks((RowGroupCollection *)
                             CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                             (CollectionCheckpointState *)in_stack_fffffffffffffca0,
                             (VacuumState *)in_stack_fffffffffffffc98,
                             (idx_t)in_stack_fffffffffffffc90,
                             SUB81((ulong)in_stack_fffffffffffffc88 >> 0x38,0));
    local_121 = in_stack_fffffffffffffcaf;
    if ((bool)in_stack_fffffffffffffcaf) {
      local_108 = local_108 + 1;
    }
    else {
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
                         0xbb2a3e);
      if (bVar1) {
        in_stack_fffffffffffffca0 =
             unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *
                        )in_stack_fffffffffffffc00);
        RowGroup::MoveToCollection
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                   (idx_t)in_stack_fffffffffffffc30);
        GetCheckpointTask(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                          (idx_t)in_stack_fffffffffffffbf8);
        in_stack_fffffffffffffc98 =
             unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::
             operator->((unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                         *)in_stack_fffffffffffffc00);
        in_stack_fffffffffffffc90 = local_138;
        unique_ptr<duckdb::Task,std::default_delete<duckdb::Task>,true>::
        unique_ptr<duckdb::CheckpointTask,std::default_delete<std::unique_ptr<duckdb::Task,std::default_delete<duckdb::Task>>>,void>
                  ((unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                   in_stack_fffffffffffffc00,
                   (unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>_>
                    *)in_stack_fffffffffffffbf8);
        TaskExecutor::ScheduleTask
                  ((TaskExecutor *)in_stack_fffffffffffffc40,
                   (unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                   in_stack_fffffffffffffc38);
        unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)0xbb2b00);
        in_stack_fffffffffffffc88 =
             unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *
                        )in_stack_fffffffffffffc00);
        _Var3 = ::std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc08);
        local_f8 = _Var3 + local_f8;
        unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>::
        ~unique_ptr((unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
                     *)0xbb2b49);
      }
    }
  }
  unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::operator->
            ((unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true> *)
             in_stack_fffffffffffffc00);
  TaskExecutor::WorkOnTasks((TaskExecutor *)in_stack_fffffffffffffc50);
  local_248 = 0;
  local_250 = 0;
  do {
    uVar5 = local_250;
    sVar2 = ::std::
            vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
            ::size(local_40);
    if (sVar2 <= uVar5) {
      ::std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc10,
                 (__int_type)in_stack_fffffffffffffc08);
      VacuumState::~VacuumState((VacuumState *)0xbb3120);
      CollectionCheckpointState::~CollectionCheckpointState(in_stack_fffffffffffffc00);
      vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::~vector
                ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)0xbb313a);
      SegmentLock::~SegmentLock((SegmentLock *)0xbb3147);
      return;
    }
    local_258 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                          ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)
                           in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
                       0xbb2d6d);
    if (bVar1) {
      local_260 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator*((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                             *)in_stack_fffffffffffffc00);
      vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
                    *)in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
      unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
      unique_ptr((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                  *)in_stack_fffffffffffffc00,
                 (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                  *)in_stack_fffffffffffffbf8);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>
                          *)0xbb2dd6);
      if (!bVar1) {
        local_28a = 1;
        msg = (string *)__cxa_allocate_exception(0x10);
        this_00 = &local_289;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_288,"Missing row group writer for index %llu",this_00);
        InternalException::InternalException<unsigned_long>
                  ((InternalException *)this_00,msg,(unsigned_long)in_stack_fffffffffffffc30);
        local_28a = 0;
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      }
      in_stack_fffffffffffffc30 =
           (TableStatistics *)
           vector<duckdb::RowGroupWriteData,_true>::operator[]
                     ((vector<duckdb::RowGroupWriteData,_true> *)in_stack_fffffffffffffc00,
                      (size_type)in_stack_fffffffffffffbf8);
      RowGroupWriteData::RowGroupWriteData
                ((RowGroupWriteData *)in_stack_fffffffffffffc00,
                 (RowGroupWriteData *)in_stack_fffffffffffffbf8);
      unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
      operator*((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                 *)in_stack_fffffffffffffc00);
      RowGroup::Checkpoint
                ((RowGroup *)e,(RowGroupWriteData *)error.extra_info._M_h._M_single_bucket,
                 (RowGroupWriter *)error.extra_info._M_h._M_rehash_policy._M_next_resize,
                 (TableStatistics *)error.extra_info._M_h._M_rehash_policy._0_8_);
      RowGroupWriteData::~RowGroupWriteData((RowGroupWriteData *)in_stack_fffffffffffffc00);
      ppTVar4 = &local_310.writer;
      in_stack_fffffffffffffc10 = local_10;
      unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
      unique_ptr((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                  *)in_stack_fffffffffffffc00,
                 (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                  *)in_stack_fffffffffffffbf8);
      (**(code **)((long)&(((in_stack_fffffffffffffc10->lock)._M_device)->super___mutex_base).
                          _M_mutex + 0x20))
                (in_stack_fffffffffffffc10,
                 (pointer *)
                 ((long)&local_310.write_data.
                         super_vector<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>
                         .
                         super__Vector_base<duckdb::RowGroupWriteData,_std::allocator<duckdb::RowGroupWriteData>_>
                         ._M_impl.super__Vector_impl_data + 8),ppTVar4);
      unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
      ~unique_ptr((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                   *)0xbb2f98);
      in_stack_fffffffffffffc08 =
           (RowGroupCollection *)
           shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_fffffffffffffc00);
      in_stack_fffffffffffffc00 = &local_310;
      unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::unique_ptr
                ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 in_stack_fffffffffffffc00,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 in_stack_fffffffffffffbf8);
      SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                ((SegmentTree<duckdb::RowGroup,_true> *)in_stack_fffffffffffffc40,
                 (SegmentLock *)in_stack_fffffffffffffc38,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 in_stack_fffffffffffffc30);
      unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::~unique_ptr
                ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 0xbb2ff4);
      _Var3 = ::std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)in_stack_fffffffffffffc08);
      local_248 = _Var3 + local_248;
      RowGroupPointer::~RowGroupPointer((RowGroupPointer *)in_stack_fffffffffffffc00);
      unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
      ~unique_ptr((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                   *)0xbb302f);
    }
    local_250 = local_250 + 1;
  } while( true );
}

Assistant:

void RowGroupCollection::Checkpoint(TableDataWriter &writer, TableStatistics &global_stats) {
	auto l = row_groups->Lock();
	auto segments = row_groups->MoveSegments(l);

	CollectionCheckpointState checkpoint_state(*this, writer, segments, global_stats);

	VacuumState vacuum_state;
	InitializeVacuumState(checkpoint_state, vacuum_state, segments);

	try {
		// schedule tasks
		idx_t total_vacuum_tasks = 0;
		auto &config = DBConfig::GetConfig(writer.GetDatabase());

		for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
			auto &entry = segments[segment_idx];
			auto vacuum_tasks = ScheduleVacuumTasks(checkpoint_state, vacuum_state, segment_idx,
			                                        total_vacuum_tasks < config.options.max_vacuum_tasks);
			if (vacuum_tasks) {
				// vacuum tasks were scheduled - don't schedule a checkpoint task yet
				total_vacuum_tasks++;
				continue;
			}
			if (!entry.node) {
				// row group was vacuumed/dropped - skip
				continue;
			}
			// schedule a checkpoint task for this row group
			entry.node->MoveToCollection(*this, vacuum_state.row_start);
			auto checkpoint_task = GetCheckpointTask(checkpoint_state, segment_idx);
			checkpoint_state.executor->ScheduleTask(std::move(checkpoint_task));
			vacuum_state.row_start += entry.node->count;
		}
	} catch (const std::exception &e) {
		ErrorData error(e);
		checkpoint_state.executor->PushError(std::move(error));
		checkpoint_state.executor->WorkOnTasks(); // ensure all tasks have completed first before rethrowing
		throw;
	}
	// all tasks have been successfully scheduled - execute tasks until we are done
	checkpoint_state.executor->WorkOnTasks();

	// no errors - finalize the row groups
	idx_t new_total_rows = 0;
	for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
		auto &entry = segments[segment_idx];
		if (!entry.node) {
			// row group was vacuumed/dropped - skip
			continue;
		}
		auto &row_group = *entry.node;
		auto row_group_writer = std::move(checkpoint_state.writers[segment_idx]);
		if (!row_group_writer) {
			throw InternalException("Missing row group writer for index %llu", segment_idx);
		}
		auto pointer =
		    row_group.Checkpoint(std::move(checkpoint_state.write_data[segment_idx]), *row_group_writer, global_stats);
		writer.AddRowGroup(std::move(pointer), std::move(row_group_writer));
		row_groups->AppendSegment(l, std::move(entry.node));
		new_total_rows += row_group.count;
	}
	total_rows = new_total_rows;
}